

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall GreenRoomFourAction::Go(GreenRoomFourAction *this)

{
  itemLocation iVar1;
  itemType iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  allocator local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  itemType local_1c;
  GreenRoomFourAction *local_18;
  GreenRoomFourAction *this_local;
  
  local_1c = KID;
  local_18 = this;
  this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_1c);
  iVar1 = ItemWrapper::getLocation(this_00);
  if (iVar1 == HIDDEN) {
    pAVar3 = (ActionResults *)operator_new(0x30);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "You find yourself in the keyroom again. Your Green Key is goneand you can not go through the door again."
               ,&local_41);
    ActionResults::ActionResults(pAVar3,THREE_KEY_ROOM,(string *)local_40);
    local_55 = 0;
    this_local = (GreenRoomFourAction *)pAVar3;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar2 == NORTH) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      local_7a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,"You can\'t go north, you can only go south.\n",&local_79);
      ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_78);
      local_7a = 0;
      this_local = (GreenRoomFourAction *)pAVar3;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar2 == SOUTH) {
        pAVar3 = (ActionResults *)operator_new(0x30);
        local_a2 = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"You go back to green room.\n",&local_a1);
        ActionResults::ActionResults(pAVar3,G_ROOM2_BUCKET,(string *)local_a0);
        local_a2 = 0;
        this_local = (GreenRoomFourAction *)pAVar3;
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      else {
        iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        if (iVar2 == EAST) {
          pAVar3 = (ActionResults *)operator_new(0x30);
          local_ca = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_c8,"You can\'t go west, you can only go south..\n",&local_c9);
          ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_c8);
          local_ca = 0;
          this_local = (GreenRoomFourAction *)pAVar3;
          std::__cxx11::string::~string(local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        }
        else {
          iVar2 = Command::getMainItem((this->super_AbstractRoomAction).commands);
          if (iVar2 == WEST) {
            pAVar3 = (ActionResults *)operator_new(0x30);
            local_f2 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_f0,"You can\'t go west, you can only go south..\n",&local_f1);
            ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_f0);
            local_f2 = 0;
            this_local = (GreenRoomFourAction *)pAVar3;
            std::__cxx11::string::~string(local_f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          }
          else {
            pAVar3 = (ActionResults *)operator_new(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_118,"You can\'t go there.\n",&local_119);
            ActionResults::ActionResults(pAVar3,CURRENT,(string *)local_118);
            this_local = (GreenRoomFourAction *)pAVar3;
            std::__cxx11::string::~string(local_118);
            std::allocator<char>::~allocator((allocator<char> *)&local_119);
          }
        }
      }
    }
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * GreenRoomFourAction::Go() {

    if(itemList->getValue(KID)->getLocation() == HIDDEN) {
        return new ActionResults(THREE_KEY_ROOM, "You find yourself in the keyroom again. Your Green Key is gone"
                "and you can not go through the door again.");
    }
    if (commands->getMainItem() == NORTH) {
        return new ActionResults(CURRENT, "You can't go north, you can only go south.\n");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(G_ROOM2_BUCKET, "You go back to green room.\n");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south..\n");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south..\n");
    }
    return new ActionResults(CURRENT,"You can't go there.\n");

}